

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenStreamRecognitionException.hpp
# Opt level: O2

void __thiscall
antlr::TokenStreamRecognitionException::TokenStreamRecognitionException
          (TokenStreamRecognitionException *this,RecognitionException *re)

{
  string sStack_38;
  
  (*(re->super_ANTLRException)._vptr_ANTLRException[3])(&sStack_38);
  TokenStreamException::TokenStreamException(&this->super_TokenStreamException,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  (this->super_TokenStreamException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__TokenStreamRecognitionException_002c1860;
  RecognitionException::RecognitionException(&this->recog,re);
  return;
}

Assistant:

TokenStreamRecognitionException(RecognitionException& re)
	: TokenStreamException(re.getMessage())
	, recog(re)
	{
	}